

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeDebugCompilationUnit(Builder *this)

{
  bool bVar1;
  Id typeId;
  Id IVar2;
  Instruction *pIVar3;
  value_type local_30;
  Instruction *local_28;
  Instruction *sourceInst;
  Builder *pBStack_18;
  Id resultId;
  Builder *this_local;
  
  if (this->nonSemanticShaderCompilationUnitId == 0) {
    pBStack_18 = this;
    sourceInst._4_4_ = getUniqueId(this);
    pIVar3 = (Instruction *)::operator_new(0x60);
    IVar2 = sourceInst._4_4_;
    typeId = makeVoidType(this);
    spv::Instruction::Instruction(pIVar3,IVar2,typeId,OpExtInst);
    local_28 = pIVar3;
    spv::Instruction::reserveOperands(pIVar3,6);
    spv::Instruction::addIdOperand(local_28,this->nonSemanticShaderDebugInfo);
    spv::Instruction::addImmediateOperand(local_28,1);
    pIVar3 = local_28;
    IVar2 = makeUintConstant(this,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    pIVar3 = local_28;
    IVar2 = makeUintConstant(this,4,false);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    pIVar3 = local_28;
    IVar2 = makeDebugSource(this,this->mainFileId);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    pIVar3 = local_28;
    IVar2 = makeUintConstant(this,this->sourceLang,false);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
               local_28);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_30);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_30);
    Module::mapInstruction(&this->module,local_28);
    this->nonSemanticShaderCompilationUnitId = sourceInst._4_4_;
    bVar1 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
            empty(&this->currentDebugScopeId);
    if (!bVar1) {
      __assert_fail("currentDebugScopeId.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x4a8,"Id spv::Builder::makeDebugCompilationUnit()");
    }
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              (&this->currentDebugScopeId,&this->nonSemanticShaderCompilationUnitId);
    this_local._4_4_ = sourceInst._4_4_;
  }
  else {
    this_local._4_4_ = this->nonSemanticShaderCompilationUnitId;
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::makeDebugCompilationUnit() {
    if (nonSemanticShaderCompilationUnitId != 0)
        return nonSemanticShaderCompilationUnitId;
    spv::Id resultId = getUniqueId();
    Instruction* sourceInst = new Instruction(resultId, makeVoidType(), OpExtInst);
    sourceInst->reserveOperands(6);
    sourceInst->addIdOperand(nonSemanticShaderDebugInfo);
    sourceInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugCompilationUnit);
    sourceInst->addIdOperand(makeUintConstant(1)); // TODO(greg-lunarg): Get rid of magic number
    sourceInst->addIdOperand(makeUintConstant(4)); // TODO(greg-lunarg): Get rid of magic number
    sourceInst->addIdOperand(makeDebugSource(mainFileId));
    sourceInst->addIdOperand(makeUintConstant(sourceLang));
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(sourceInst));
    module.mapInstruction(sourceInst);
    nonSemanticShaderCompilationUnitId = resultId;

    // We can reasonably assume that makeDebugCompilationUnit will be called before any of
    // debug-scope stack. Function scopes and lexical scopes will occur afterward.
    assert(currentDebugScopeId.empty());
    currentDebugScopeId.push(nonSemanticShaderCompilationUnitId);

    return resultId;
}